

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O0

void __thiscall BamTools::Internal::BamHeader::CheckMagicNumber(BamHeader *this,BgzfStream *stream)

{
  bool bVar1;
  undefined8 uVar2;
  size_t numBytesRead;
  char buffer [4];
  size_t in_stack_ffffffffffffff28;
  allocator *paVar3;
  undefined6 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff36;
  undefined1 uVar4;
  allocator in_stack_ffffffffffffff37;
  BgzfStream *in_stack_ffffffffffffff38;
  BamException *in_stack_ffffffffffffff40;
  allocator local_a1;
  string local_a0 [38];
  undefined1 local_7a;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [32];
  size_t local_20;
  
  local_20 = BgzfStream::Read(in_stack_ffffffffffffff38,
                              (char *)CONCAT17(in_stack_ffffffffffffff37,
                                               CONCAT16(in_stack_ffffffffffffff36,
                                                        in_stack_ffffffffffffff30)),
                              in_stack_ffffffffffffff28);
  if (local_20 != 4) {
    local_7a = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    paVar3 = &local_41;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"BamHeader::CheckMagicNumber",paVar3);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_78,"could not read magic number",&local_79);
    BamException::BamException
              (in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38,
               (string *)
               CONCAT17(in_stack_ffffffffffffff37,
                        CONCAT16(in_stack_ffffffffffffff36,in_stack_ffffffffffffff30)));
    local_7a = 0;
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  bVar1 = isValidMagicNumber((char *)0x2ca846);
  if (!bVar1) {
    uVar4 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a0,"BamHeader::CheckMagicNumber",&local_a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff38,"invalid magic number",
               (allocator *)&stack0xffffffffffffff37);
    BamException::BamException
              (in_stack_ffffffffffffff40,(string *)in_stack_ffffffffffffff38,
               (string *)
               CONCAT17(in_stack_ffffffffffffff37,CONCAT16(uVar4,in_stack_ffffffffffffff30)));
    __cxa_throw(uVar2,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamHeader::CheckMagicNumber(BgzfStream* stream)
{

    // try to read magic number
    char buffer[Constants::BAM_HEADER_MAGIC_LENGTH];
    const std::size_t numBytesRead = stream->Read(buffer, Constants::BAM_HEADER_MAGIC_LENGTH);
    if (numBytesRead != (int)Constants::BAM_HEADER_MAGIC_LENGTH)
        throw BamException("BamHeader::CheckMagicNumber", "could not read magic number");

    // validate magic number
    if (!isValidMagicNumber(buffer))
        throw BamException("BamHeader::CheckMagicNumber", "invalid magic number");
}